

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O3

Hop_Obj_t * Nwk_NodeIfToHop(Hop_Man_t *pHopMan,If_Man_t *pIfMan,If_Obj_t *pIfObj)

{
  int iVar1;
  void *pvVar2;
  Hop_Obj_t *pHVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  
  if (*(uint *)&(pIfObj->CutBest).field_0x1c < 0x2000000) {
    __assert_fail("pCut->nLeaves > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/nwk/nwkMap.c"
                  ,0xf3,"Hop_Obj_t *Nwk_NodeIfToHop(Hop_Man_t *, If_Man_t *, If_Obj_t *)");
  }
  uVar6 = 0;
  do {
    iVar1 = *(int *)(&pIfObj[1].field_0x0 + uVar6 * 4);
    if (((long)iVar1 < 0) || (pIfMan->vObjs->nSize <= iVar1)) goto LAB_0047e796;
    pvVar2 = pIfMan->vObjs->pArray[iVar1];
    if (pvVar2 == (void *)0x0) break;
    pHVar3 = Hop_IthVar(pHopMan,(int)uVar6);
    *(Hop_Obj_t **)((long)pvVar2 + 0x50) = pHVar3;
    uVar6 = uVar6 + 1;
  } while (uVar6 < (byte)(pIfObj->CutBest).field_0x1f);
  pVVar5 = pIfMan->vTemp;
  pVVar5->nSize = 0;
  pHVar3 = Nwk_NodeIfToHop2_rec(pHopMan,pIfMan,pIfObj,pVVar5);
  if (pHVar3 == (Hop_Obj_t *)0x1) {
    puts("Nwk_NodeIfToHop(): Computing local AIG has failed.");
    pHVar3 = (Hop_Obj_t *)0x0;
  }
  else {
    if (0xffffff < *(uint *)&(pIfObj->CutBest).field_0x1c) {
      uVar6 = 0;
      do {
        iVar1 = *(int *)(&pIfObj[1].field_0x0 + uVar6 * 4);
        if (((long)iVar1 < 0) || (pIfMan->vObjs->nSize <= iVar1)) {
LAB_0047e796:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = pIfMan->vObjs->pArray[iVar1];
        if (pvVar2 == (void *)0x0) break;
        *(undefined8 *)((long)pvVar2 + 0x50) = 0;
        uVar6 = uVar6 + 1;
      } while (uVar6 < (byte)(pIfObj->CutBest).field_0x1f);
    }
    pVVar5 = pIfMan->vTemp;
    if (0 < pVVar5->nSize) {
      lVar4 = 0;
      do {
        *(undefined8 *)pVVar5->pArray[lVar4] = 0;
        lVar4 = lVar4 + 1;
        pVVar5 = pIfMan->vTemp;
      } while (lVar4 < pVVar5->nSize);
    }
  }
  return pHVar3;
}

Assistant:

Hop_Obj_t * Nwk_NodeIfToHop( Hop_Man_t * pHopMan, If_Man_t * pIfMan, If_Obj_t * pIfObj )
{
    If_Cut_t * pCut;
    Hop_Obj_t * gFunc;
    If_Obj_t * pLeaf;
    int i;
    // get the best cut
    pCut = If_ObjCutBest(pIfObj);
    assert( pCut->nLeaves > 1 );
    // set the leaf variables
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), Hop_IthVar(pHopMan, i) );
    // recursively compute the function while collecting visited cuts
    Vec_PtrClear( pIfMan->vTemp );
    gFunc = Nwk_NodeIfToHop2_rec( pHopMan, pIfMan, pIfObj, pIfMan->vTemp ); 
    if ( gFunc == (void *)1 )
    {
        printf( "Nwk_NodeIfToHop(): Computing local AIG has failed.\n" );
        return NULL;
    }
//    printf( "%d ", Vec_PtrSize(p->vTemp) );
    // clean the cuts
    If_CutForEachLeaf( pIfMan, pCut, pLeaf, i )
        If_CutSetData( If_ObjCutBest(pLeaf), NULL );
    Vec_PtrForEachEntry( If_Cut_t *, pIfMan->vTemp, pCut, i )
        If_CutSetData( pCut, NULL );
    return gFunc;
}